

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * __thiscall CMU462::Matrix4x4::operator-(Matrix4x4 *this)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  Matrix4x4 *B;
  Matrix4x4 *in_RDI;
  
  uVar1 = *(uint *)((long)&this->entries[0].x + 4);
  uVar2 = *(undefined4 *)&this->entries[0].y;
  uVar3 = *(uint *)((long)&this->entries[0].y + 4);
  *(undefined4 *)&in_RDI->entries[0].x = *(undefined4 *)&this->entries[0].x;
  *(uint *)((long)&in_RDI->entries[0].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[0].y = uVar2;
  *(uint *)((long)&in_RDI->entries[0].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[1].x + 4);
  uVar2 = *(undefined4 *)&this->entries[1].y;
  uVar3 = *(uint *)((long)&this->entries[1].y + 4);
  *(undefined4 *)&in_RDI->entries[1].x = *(undefined4 *)&this->entries[1].x;
  *(uint *)((long)&in_RDI->entries[1].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[1].y = uVar2;
  *(uint *)((long)&in_RDI->entries[1].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[2].x + 4);
  uVar2 = *(undefined4 *)&this->entries[2].y;
  uVar3 = *(uint *)((long)&this->entries[2].y + 4);
  *(undefined4 *)&in_RDI->entries[2].x = *(undefined4 *)&this->entries[2].x;
  *(uint *)((long)&in_RDI->entries[2].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[2].y = uVar2;
  *(uint *)((long)&in_RDI->entries[2].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[3].x + 4);
  uVar2 = *(undefined4 *)&this->entries[3].y;
  uVar3 = *(uint *)((long)&this->entries[3].y + 4);
  *(undefined4 *)&in_RDI->entries[3].x = *(undefined4 *)&this->entries[3].x;
  *(uint *)((long)&in_RDI->entries[3].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[3].y = uVar2;
  *(uint *)((long)&in_RDI->entries[3].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[0].z + 4);
  uVar2 = *(undefined4 *)&this->entries[0].w;
  uVar3 = *(uint *)((long)&this->entries[0].w + 4);
  *(undefined4 *)&in_RDI->entries[0].z = *(undefined4 *)&this->entries[0].z;
  *(uint *)((long)&in_RDI->entries[0].z + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[0].w = uVar2;
  *(uint *)((long)&in_RDI->entries[0].w + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[1].z + 4);
  uVar2 = *(undefined4 *)&this->entries[1].w;
  uVar3 = *(uint *)((long)&this->entries[1].w + 4);
  *(undefined4 *)&in_RDI->entries[1].z = *(undefined4 *)&this->entries[1].z;
  *(uint *)((long)&in_RDI->entries[1].z + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[1].w = uVar2;
  *(uint *)((long)&in_RDI->entries[1].w + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[2].z + 4);
  uVar2 = *(undefined4 *)&this->entries[2].w;
  uVar3 = *(uint *)((long)&this->entries[2].w + 4);
  *(undefined4 *)&in_RDI->entries[2].z = *(undefined4 *)&this->entries[2].z;
  *(uint *)((long)&in_RDI->entries[2].z + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[2].w = uVar2;
  *(uint *)((long)&in_RDI->entries[2].w + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[3].z + 4);
  uVar2 = *(undefined4 *)&this->entries[3].w;
  uVar3 = *(uint *)((long)&this->entries[3].w + 4);
  *(undefined4 *)&in_RDI->entries[3].z = *(undefined4 *)&this->entries[3].z;
  *(uint *)((long)&in_RDI->entries[3].z + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[3].w = uVar2;
  *(uint *)((long)&in_RDI->entries[3].w + 4) = uVar3 ^ 0x80000000;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator-( void ) const {

  // returns -A (Negation).
  const Matrix4x4& A( *this );
  Matrix4x4 B;

  B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2); B(0,3) = -A(0,3);
  B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2); B(1,3) = -A(1,3);
  B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2); B(2,3) = -A(2,3);
	B(3,0) = -A(3,0); B(3,1) = -A(3,1); B(3,2) = -A(3,2); B(3,3) = -A(3,3);

    return B;
  }